

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O1

void embree::AccelN::occluded4
               (void *valid,Intersectors *This_in,RTCRay4 *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  pAVar1 = This_in->ptr;
  lVar5 = *(long *)&pAVar1[3].type;
  if (*(long *)&pAVar1[3].field_0x58 != lVar5) {
    uVar6 = 0;
    do {
      lVar5 = *(long *)(lVar5 + uVar6 * 8);
      if (*(float *)(lVar5 + 0x10) < INFINITY) {
        uVar3 = (**(code **)(lVar5 + 0xa0))(valid,lVar5 + 0x58,ray,context);
        auVar2._4_4_ = -(uint)(0.0 <= ray->tfar[1]) & *(uint *)((long)valid + 4);
        auVar2._0_4_ = -(uint)(0.0 <= ray->tfar[0]) & *valid;
        auVar2._8_4_ = -(uint)(0.0 <= ray->tfar[2]) & *(uint *)((long)valid + 8);
        auVar2._12_4_ = -(uint)(0.0 <= ray->tfar[3]) & *(uint *)((long)valid + 0xc);
        iVar4 = movmskps(uVar3,auVar2);
        if (iVar4 == 0) {
          return;
        }
      }
      uVar6 = uVar6 + 1;
      lVar5 = *(long *)&pAVar1[3].type;
    } while (uVar6 < (ulong)(*(long *)&pAVar1[3].field_0x58 - lVar5 >> 3));
  }
  return;
}

Assistant:

void AccelN::occluded4 (const void* valid, Accel::Intersectors* This_in, RTCRay4& ray, RayQueryContext* context) 
  {
    AccelN* This = (AccelN*)This_in->ptr;
    for (size_t i=0; i<This->accels.size(); i++) {
      if (This->accels[i]->isEmpty()) continue;
      This->accels[i]->intersectors.occluded4(valid,ray,context);
#if defined(__SSE2__) || defined(__ARM_NEON)
      vbool4 valid0 = asBool(((vint4*)valid)[0]);
      vbool4 hit0   = ((vfloat4*)ray.tfar)[0] >= vfloat4(zero);
      if (unlikely(none(valid0 & hit0))) break;
#endif
    }
  }